

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e8ba::CpuTest_reset_clears_pipeline_Test::TestBody
          (CpuTest_reset_clears_pipeline_Test *this)

{
  bool bVar1;
  MockSpec<unsigned_char_(unsigned_short)> *pMVar2;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar3;
  pointer pIVar4;
  char *message;
  AssertHelper local_188;
  Message local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar;
  Action<unsigned_char_(unsigned_short)> local_158;
  WithoutMatchers local_131;
  Matcher<unsigned_short> local_130;
  MockSpec<unsigned_char_(unsigned_short)> local_118;
  ReturnAction<int> local_f8;
  Action<unsigned_char_(unsigned_short)> local_e8;
  WithoutMatchers local_c1;
  Matcher<unsigned_short> local_c0;
  MockSpec<unsigned_char_(unsigned_short)> local_a8;
  ReturnAction<int> local_88;
  Action<unsigned_char_(unsigned_short)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<unsigned_short> local_48;
  MockSpec<unsigned_char_(unsigned_short)> local_30;
  CpuTest_reset_clears_pipeline_Test *local_10;
  CpuTest_reset_clears_pipeline_Test *this_local;
  
  local_10 = this;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,'8');
  testing::Matcher<unsigned_short>::Matcher(&local_48,0xfffc);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_30,&(this->super_CpuTest).mmu.super_MockMmu,&local_48);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_30,local_55,(void *)0x0);
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x1e,"mmu","read_byte(kResetAddress)");
  testing::Return<int>((testing *)&local_88,0xad);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_78,(ReturnAction *)&local_88);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar3,&local_78);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_78);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_88);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_30);
  testing::Matcher<unsigned_short>::~Matcher(&local_48);
  testing::Matcher<unsigned_short>::Matcher(&local_c0,0xfffd);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_a8,&(this->super_CpuTest).mmu.super_MockMmu,&local_c0);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_a8,&local_c1,(void *)0x0);
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x1f,"mmu","read_byte(kResetAddress + 1u)");
  testing::Return<int>((testing *)&local_f8,0xde);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_e8,(ReturnAction *)&local_f8);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar3,&local_e8);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_e8);
  testing::internal::ReturnAction<int>::~ReturnAction(&local_f8);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_a8);
  testing::Matcher<unsigned_short>::~Matcher(&local_c0);
  testing::Matcher<unsigned_short>::Matcher(&local_130,0xdead);
  n_e_s::core::test::MockMmu::gmock_read_byte
            (&local_118,&(this->super_CpuTest).mmu.super_MockMmu,&local_130);
  testing::internal::GetWithoutMatchers();
  pMVar2 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::operator()
                     (&local_118,&local_131,(void *)0x0);
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x20,"mmu","read_byte(0xDEAD)");
  testing::Return<int>((testing *)&gtest_ar.message_,0);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_158,(ReturnAction *)&gtest_ar.message_);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce(pTVar3,&local_158);
  testing::Action<unsigned_char_(unsigned_short)>::~Action(&local_158);
  testing::internal::ReturnAction<int>::~ReturnAction((ReturnAction<int> *)&gtest_ar.message_);
  testing::internal::MockSpec<unsigned_char_(unsigned_short)>::~MockSpec(&local_118);
  testing::Matcher<unsigned_short>::~Matcher(&local_130);
  (this->super_CpuTest).expected.pc = 0xdeae;
  pIVar4 = std::unique_ptr<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>::
           operator->(&(this->super_CpuTest).cpu);
  (*(pIVar4->super_ICpu)._vptr_ICpu[2])();
  pIVar4 = std::unique_ptr<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>::
           operator->(&(this->super_CpuTest).cpu);
  (*(pIVar4->super_ICpu)._vptr_ICpu[3])();
  pIVar4 = std::unique_ptr<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>::
           operator->(&(this->super_CpuTest).cpu);
  (*(pIVar4->super_ICpu)._vptr_ICpu[2])();
  testing::internal::EqHelper::
  Compare<n_e_s::core::CpuRegisters,_n_e_s::core::CpuRegisters,_nullptr>
            ((EqHelper *)local_178,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x28,message);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  return;
}

Assistant:

TEST_F(CpuTest, reset_clears_pipeline) {
    stage_instruction(SEC);
    EXPECT_CALL(mmu, read_byte(kResetAddress)).WillOnce(Return(0xAD));
    EXPECT_CALL(mmu, read_byte(kResetAddress + 1u)).WillOnce(Return(0xDE));
    EXPECT_CALL(mmu, read_byte(0xDEAD)).WillOnce(Return(0x00));
    expected.pc = 0xDEAD + 1;

    cpu->execute(); // Stage things for execution.
    cpu->reset();
    cpu->execute(); // Should read an opcode from 0xDEAD and not execute what's
                    // been staged.

    EXPECT_EQ(expected, registers);
}